

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O0

int arg_parse_int_helper(arg *arg,char *err_msg)

{
  long lVar1;
  char *in_RSI;
  long in_RDI;
  long rawval;
  char *endptr;
  char *local_20;
  char *local_18;
  long local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  lVar1 = strtol(*(char **)(in_RDI + 0x10),&local_20,10);
  if (local_18 != (char *)0x0) {
    *local_18 = '\0';
  }
  if ((**(char **)(local_10 + 0x10) == '\0') || (*local_20 != '\0')) {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Invalid character \'%c\'\n",*(undefined8 *)(local_10 + 8),
               (ulong)(uint)(int)*local_20);
    }
    local_4 = 0;
  }
  else if ((lVar1 < -0x80000000) || (0x7fffffff < lVar1)) {
    if (local_18 != (char *)0x0) {
      snprintf(local_18,200,"Option %s: Value %ld out of range for signed int\n",
               *(undefined8 *)(local_10 + 8),lVar1);
    }
    local_4 = 0;
  }
  else {
    local_4 = (int)lVar1;
  }
  return local_4;
}

Assistant:

int arg_parse_int_helper(const struct arg *arg, char *err_msg) {
  char *endptr;
  const long rawval = strtol(arg->val, &endptr, 10);  // NOLINT

  if (err_msg) err_msg[0] = '\0';

  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    if (rawval >= INT_MIN && rawval <= INT_MAX) return (int)rawval;
    SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                   arg->name, rawval);
    return 0;
  }
  SET_ERR_STRING("Option %s: Invalid character '%c'\n", arg->name, *endptr);
  return 0;
}